

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat.cpp
# Opt level: O3

double DecodeDouble(uint64_t v)

{
  ulong uVar1;
  long lVar2;
  int __exponent;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  double dVar5;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = v & 0x7fffffffffffffff;
  uVar1 = *(ulong *)(&DAT_01154ac0 + (ulong)(-1 < (long)v) * 8);
  if (uVar3 == 0x7ff0000000000000) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00df89f4;
    dVar5 = (double)(uVar1 & 0x8000000000000000 | (ulong)DAT_01154ad0);
  }
  else if (uVar3 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00df89f4;
    dVar5 = (double)(uVar1 & 0x8000000000000000);
  }
  else if (uVar3 >> 0x34 == 0x7ff) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
LAB_00df89f4:
      __stack_chk_fail();
    }
    dVar5 = NAN;
  }
  else {
    uVar4 = v & 0xfffffffffffff;
    if (uVar3 < 0x10000000000000) {
      __exponent = -0x432;
    }
    else {
      uVar4 = uVar4 | 0x10000000000000;
      __exponent = (uint)(uVar3 >> 0x34) - 0x433;
    }
    dVar5 = ldexp((double)uVar4,__exponent);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_00df89f4;
    dVar5 = (double)((ulong)ABS(dVar5) | uVar1 & 0x8000000000000000);
  }
  return dVar5;
}

Assistant:

double DecodeDouble(uint64_t v) noexcept {
    static constexpr double NANVAL = std::numeric_limits<double>::quiet_NaN();
    static constexpr double INFVAL = std::numeric_limits<double>::infinity();
    double sign = 1.0;
    if (v & 0x8000000000000000) {
        sign = -1.0;
        v ^= 0x8000000000000000;
    }
    // Zero
    if (v == 0) return copysign(0.0, sign);
    // Infinity
    if (v == 0x7ff0000000000000) return copysign(INFVAL, sign);
    // Other numbers
    int exp = (v & 0x7FF0000000000000) >> 52;
    uint64_t man = v & 0xFFFFFFFFFFFFF;
    if (exp == 2047) {
        // NaN
        return NANVAL;
    } else if (exp == 0) {
        // Subnormal
        return copysign(ldexp((double)man, -1074), sign);
    } else {
        // Normal
        return copysign(ldexp((double)(man + 0x10000000000000), -1075 + exp), sign);
    }
}